

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cc
# Opt level: O2

bool __thiscall apollonia::Arbiter::operator==(Arbiter *this,Arbiter *other)

{
  pointer pCVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  ArbiterKey local_58;
  ArbiterKey local_48;
  
  local_48.a_ = this->a_;
  local_48.b_ = this->b_;
  local_58.a_ = other->a_;
  local_58.b_ = other->b_;
  bVar2 = ArbiterKey::operator!=(&local_48,&local_58);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    uVar5 = 0xffffffffffffffff;
    lVar4 = 0;
    do {
      pCVar1 = (this->contacts_).
               super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = uVar5 + 1;
      bVar2 = (ulong)(((long)(this->contacts_).
                             super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x48) <=
              uVar5;
      if (bVar2) {
        return bVar2;
      }
      bVar3 = Contact::operator!=((Contact *)
                                  ((long)&(((Contact *)(&pCVar1->from_a + -0xc))->position).x +
                                  lVar4),(Contact *)
                                         ((long)&(((Contact *)
                                                  (&((other->contacts_).
                                                                                                          
                                                  super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->from_a
                                                  + -0xc))->position).x + lVar4));
      lVar4 = lVar4 + 0x48;
    } while (!bVar3);
  }
  return bVar2;
}

Assistant:

bool Arbiter::operator==(const Arbiter& other) const {
  if (ArbiterKey(*this) != ArbiterKey(other)) {
    return false;
  }
  for (size_t i = 0; i < contacts_.size(); ++i) {
    if (contacts_[i] != other.contacts_[i]) {
      return false;
    }
  }
  return true;
}